

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O0

HRESULT __thiscall
Js::SimpleDataCacheWrapper::SeekReadStreamToBlock
          (SimpleDataCacheWrapper *this,BlockType blockType,ULONG *bytesInBlock)

{
  HRESULT hr;
  ULONG *bytesInBlock_local;
  BlockType blockType_local;
  SimpleDataCacheWrapper *this_local;
  
  if (bytesInBlock != (ULONG *)0x0) {
    *bytesInBlock = 0;
  }
  this_local._4_4_ = ResetReadStream(this);
  if (-1 < this_local._4_4_) {
    this_local._4_4_ = SeekReadStreamToBlockHelper(this,blockType,bytesInBlock);
  }
  return this_local._4_4_;
}

Assistant:

HRESULT SimpleDataCacheWrapper::SeekReadStreamToBlock(_In_ BlockType blockType, _Out_opt_ ULONG* bytesInBlock)
    {
        HRESULT hr;

        if (bytesInBlock != nullptr)
        {
            *bytesInBlock = 0;
        }

        IFFAILRET(ResetReadStream());

        // Reset above has moved the seek pointer to just after the header, we're at the first block.
        return SeekReadStreamToBlockHelper(blockType, bytesInBlock);
    }